

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateCBTests.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::anon_unknown_4::BlendConstantsTestInstance::initPipeline
          (BlendConstantsTestInstance *this,VkDevice device)

{
  DeviceInterface *pDVar1;
  StencilOpState _front;
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  RefData<vk::Handle<(vk::HandleType)18>_> data_01;
  StencilOpState _back;
  VkAllocationCallbacks *pVVar2;
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  ProgramBinary *pPVar4;
  Handle<(vk::HandleType)16> *pHVar5;
  Handle<(vk::HandleType)17> *pHVar6;
  Handle<(vk::HandleType)14> *pHVar7;
  VkPipelineCache local_7c8;
  Move<vk::Handle<(vk::HandleType)18>_> local_7c0;
  RefData<vk::Handle<(vk::HandleType)18>_> local_7a0;
  allocator<vk::VkDynamicState> local_779;
  vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> local_778;
  DynamicState local_760;
  allocator<unsigned_int> local_725;
  value_type_conflict1 local_724;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_720;
  MultiSampleState local_708;
  VkPipelineRasterizationStateCreateInfo local_6c0;
  VkStencilOpState local_680;
  VkStencilOpState local_660;
  VkPipelineDepthStencilStateCreateInfo local_640;
  allocator<vk::VkRect2D> local_5d1;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_5d0;
  allocator<vk::VkViewport> local_5b1;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_5b0;
  ViewportState local_598;
  ColorBlendState local_538;
  VkPipelineInputAssemblyStateCreateInfo local_4e8;
  VkPipelineVertexInputStateCreateInfo local_4c8;
  deUint64 local_490;
  VkPipelineShaderStageCreateInfo local_488;
  deUint64 local_458;
  VkPipelineShaderStageCreateInfo local_450;
  deUint64 local_420;
  VkPipelineLayout local_418;
  undefined1 local_410 [8];
  PipelineCreateInfo pipelineCreateInfo;
  pointer puStack_108;
  VkPipelineColorBlendAttachmentState VkPipelineColorBlendAttachmentState;
  RefData<vk::Handle<(vk::HandleType)14>_> local_c8;
  undefined1 local_a8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fs;
  Move<vk::Handle<(vk::HandleType)14>_> local_78;
  RefData<vk::Handle<(vk::HandleType)14>_> local_58;
  undefined1 local_38 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vs;
  VkDevice device_local;
  BlendConstantsTestInstance *this_local;
  
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)device;
  pPVar3 = Context::getBinaryCollection
                     ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  pPVar4 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (pPVar3,&(this->super_DynamicStateBaseClass).m_vertexShaderName);
  ::vk::createShaderModule(&local_78,pDVar1,device,pPVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_58,(Move *)&local_78);
  data.deleter.m_deviceIface._0_4_ = (int)local_58.deleter.m_deviceIface;
  data.object.m_internal = local_58.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_58.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_58.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_58.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_58.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_58.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_38,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_78);
  pVVar2 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  pPVar3 = Context::getBinaryCollection
                     ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  pPVar4 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (pPVar3,&(this->super_DynamicStateBaseClass).m_fragmentShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &VkPipelineColorBlendAttachmentState.alphaBlendOp,pDVar1,(VkDevice)pVVar2,pPVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_c8,(Move *)&VkPipelineColorBlendAttachmentState.alphaBlendOp);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_c8.deleter.m_deviceIface;
  data_00.object.m_internal = local_c8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_c8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_c8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_c8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_c8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_a8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &VkPipelineColorBlendAttachmentState.alphaBlendOp);
  Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            ((Attachment *)
             &pipelineCreateInfo.m_multisampleStateSampleMask.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1,VK_BLEND_FACTOR_SRC_ALPHA,
             VK_BLEND_FACTOR_CONSTANT_COLOR,VK_BLEND_OP_ADD,VK_BLEND_FACTOR_SRC_ALPHA,
             VK_BLEND_FACTOR_CONSTANT_ALPHA,VK_BLEND_OP_ADD,0xf);
  puStack_108 = pipelineCreateInfo.m_multisampleStateSampleMask.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->super_DynamicStateBaseClass).m_pipelineLayout.
                       super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  local_418.m_internal = pHVar5->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->super_DynamicStateBaseClass).m_renderPass.
                       super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_420 = pHVar6->m_internal;
  Draw::PipelineCreateInfo::PipelineCreateInfo
            ((PipelineCreateInfo *)local_410,local_418,(VkRenderPass)local_420,0,0);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_38);
  local_458 = pHVar7->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_450,(VkShaderModule)local_458,"main",
             VK_SHADER_STAGE_VERTEX_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_410,&local_450);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_a8);
  local_490 = pHVar7->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_488,(VkShaderModule)local_490,"main",
             VK_SHADER_STAGE_FRAGMENT_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_410,&local_488);
  local_4c8.sType =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.sType;
  local_4c8._4_4_ =
       *(undefined4 *)
        &(this->super_DynamicStateBaseClass).m_vertexInputState.
         super_VkPipelineVertexInputStateCreateInfo.field_0x4;
  local_4c8.pNext =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.pNext;
  local_4c8.flags =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.flags;
  local_4c8.vertexBindingDescriptionCount =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.vertexBindingDescriptionCount;
  local_4c8.pVertexBindingDescriptions =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.pVertexBindingDescriptions;
  local_4c8.vertexAttributeDescriptionCount =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.vertexAttributeDescriptionCount;
  local_4c8._36_4_ =
       *(undefined4 *)
        &(this->super_DynamicStateBaseClass).m_vertexInputState.
         super_VkPipelineVertexInputStateCreateInfo.field_0x24;
  local_4c8.pVertexAttributeDescriptions =
       (this->super_DynamicStateBaseClass).m_vertexInputState.
       super_VkPipelineVertexInputStateCreateInfo.pVertexAttributeDescriptions;
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_410,&local_4c8);
  Draw::PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)&local_4e8,(this->super_DynamicStateBaseClass).m_topology,0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_410,&local_4e8);
  Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
            (&local_538,1,(VkPipelineColorBlendAttachmentState *)&puStack_108,0,VK_LOGIC_OP_COPY);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_410,&local_538.super_VkPipelineColorBlendStateCreateInfo);
  Draw::PipelineCreateInfo::ColorBlendState::~ColorBlendState(&local_538);
  std::allocator<vk::VkViewport>::allocator(&local_5b1);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector(&local_5b0,0,&local_5b1);
  std::allocator<vk::VkRect2D>::allocator(&local_5d1);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::vector(&local_5d0,0,&local_5d1);
  Draw::PipelineCreateInfo::ViewportState::ViewportState(&local_598,1,&local_5b0,&local_5d0);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_410,&local_598.super_VkPipelineViewportStateCreateInfo);
  Draw::PipelineCreateInfo::ViewportState::~ViewportState(&local_598);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~vector(&local_5d0);
  std::allocator<vk::VkRect2D>::~allocator(&local_5d1);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~vector(&local_5b0);
  std::allocator<vk::VkViewport>::~allocator(&local_5b1);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_660,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_680,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = local_660.depthFailOp;
  _front.super_VkStencilOpState.failOp = local_660.failOp;
  _front.super_VkStencilOpState.passOp = local_660.passOp;
  _front.super_VkStencilOpState.compareOp = local_660.compareOp;
  _front.super_VkStencilOpState.compareMask = local_660.compareMask;
  _front.super_VkStencilOpState.writeMask = local_660.writeMask;
  _front.super_VkStencilOpState.reference = local_660.reference;
  _back.super_VkStencilOpState.depthFailOp = local_680.depthFailOp;
  _back.super_VkStencilOpState.failOp = local_680.failOp;
  _back.super_VkStencilOpState.passOp = local_680.passOp;
  _back.super_VkStencilOpState.compareOp = local_680.compareOp;
  _back.super_VkStencilOpState.compareMask = local_680.compareMask;
  _back.super_VkStencilOpState.writeMask = local_680.writeMask;
  _back.super_VkStencilOpState.reference = local_680.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)&local_640,0,0,VK_COMPARE_OP_ALWAYS,0,0,_front,_back,0.0,1.0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_410,&local_640);
  Draw::PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)&local_6c0,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_410,&local_6c0);
  local_724 = 0xffffffff;
  std::allocator<unsigned_int>::allocator(&local_725);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_720,1,&local_724,&local_725);
  Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
            (&local_708,VK_SAMPLE_COUNT_1_BIT,0,0.0,&local_720,false,false);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_410,&local_708.super_VkPipelineMultisampleStateCreateInfo);
  Draw::PipelineCreateInfo::MultiSampleState::~MultiSampleState(&local_708);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_720);
  std::allocator<unsigned_int>::~allocator(&local_725);
  std::allocator<vk::VkDynamicState>::allocator(&local_779);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::vector
            (&local_778,0,&local_779);
  Draw::PipelineCreateInfo::DynamicState::DynamicState(&local_760,&local_778);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_410,&local_760.super_VkPipelineDynamicStateCreateInfo);
  Draw::PipelineCreateInfo::DynamicState::~DynamicState(&local_760);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::~vector(&local_778);
  std::allocator<vk::VkDynamicState>::~allocator(&local_779);
  pVVar2 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_7c8,0);
  ::vk::createGraphicsPipeline
            (&local_7c0,pDVar1,(VkDevice)pVVar2,local_7c8,(VkGraphicsPipelineCreateInfo *)local_410,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_7a0,(Move *)&local_7c0);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_7a0.deleter.m_deviceIface;
  data_01.object.m_internal = local_7a0.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_7a0.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_7a0.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_7a0.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_7a0.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_7a0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=
            (&(this->super_DynamicStateBaseClass).m_pipeline,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_7c0);
  Draw::PipelineCreateInfo::~PipelineCreateInfo((PipelineCreateInfo *)local_410);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_38);
  return;
}

Assistant:

virtual void initPipeline (const vk::VkDevice device)
	{
		const vk::Unique<vk::VkShaderModule> vs (createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_vertexShaderName), 0));
		const vk::Unique<vk::VkShaderModule> fs (createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_fragmentShaderName), 0));

		const vk::VkPipelineColorBlendAttachmentState VkPipelineColorBlendAttachmentState =
			PipelineCreateInfo::ColorBlendState::Attachment(VK_TRUE,
															vk::VK_BLEND_FACTOR_SRC_ALPHA, vk::VK_BLEND_FACTOR_CONSTANT_COLOR, vk::VK_BLEND_OP_ADD,
															vk::VK_BLEND_FACTOR_SRC_ALPHA, vk::VK_BLEND_FACTOR_CONSTANT_ALPHA, vk::VK_BLEND_OP_ADD);

		PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, 0);
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", vk::VK_SHADER_STAGE_VERTEX_BIT));
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", vk::VK_SHADER_STAGE_FRAGMENT_BIT));
		pipelineCreateInfo.addState(PipelineCreateInfo::VertexInputState(m_vertexInputState));
		pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(m_topology));
		pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &VkPipelineColorBlendAttachmentState));
		pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1));
		pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState());
		pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState());
		pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());
		pipelineCreateInfo.addState(PipelineCreateInfo::DynamicState());

		m_pipeline = vk::createGraphicsPipeline(m_vk, device, DE_NULL, &pipelineCreateInfo);
	}